

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avrogencpp.cc
# Opt level: O2

string * __thiscall
CodeGen::doGenerateType_abi_cxx11_(string *__return_storage_ptr__,CodeGen *this,NodePtr *n)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  peVar1 = n->px;
  switch(peVar1->type_) {
  case AVRO_STRING:
  case AVRO_BYTES:
  case AVRO_INT:
  case AVRO_LONG:
  case AVRO_FLOAT:
  case AVRO_DOUBLE:
  case AVRO_BOOL:
  case AVRO_NULL:
  case AVRO_FIXED:
    cppTypeOf_abi_cxx11_(__return_storage_ptr__,this,n);
    break;
  case AVRO_RECORD:
    generateRecordType_abi_cxx11_(__return_storage_ptr__,this,n);
    break;
  case AVRO_ENUM:
    generateEnumType_abi_cxx11_(__return_storage_ptr__,this,n);
    break;
  case AVRO_ARRAY:
    iVar2 = (*peVar1->_vptr_Node[5])(peVar1,0);
    generateType_abi_cxx11_(&local_38,this,(NodePtr *)CONCAT44(extraout_var,iVar2));
    std::operator+(&bStack_58,"std::vector<",&local_38);
    std::operator+(__return_storage_ptr__,&bStack_58," >");
    goto LAB_0015a26c;
  case AVRO_MAP:
    iVar2 = (*peVar1->_vptr_Node[5])(peVar1,1);
    generateType_abi_cxx11_(&local_38,this,(NodePtr *)CONCAT44(extraout_var_00,iVar2));
    std::operator+(&bStack_58,"std::map<std::string, ",&local_38);
    std::operator+(__return_storage_ptr__,&bStack_58," >");
LAB_0015a26c:
    std::__cxx11::string::~string((string *)&bStack_58);
    std::__cxx11::string::~string((string *)&local_38);
    break;
  case AVRO_UNION:
    generateUnionType_abi_cxx11_(__return_storage_ptr__,this,n);
    break;
  default:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"$Undefuned$",(allocator<char> *)&bStack_58);
  }
  return __return_storage_ptr__;
}

Assistant:

string CodeGen::doGenerateType(const NodePtr& n)
{
    switch (n->type()) {
    case avro::AVRO_STRING:
    case avro::AVRO_BYTES:
    case avro::AVRO_INT:
    case avro::AVRO_LONG:
    case avro::AVRO_FLOAT:
    case avro::AVRO_DOUBLE:
    case avro::AVRO_BOOL:
    case avro::AVRO_NULL:
    case avro::AVRO_FIXED:
        return cppTypeOf(n);
    case avro::AVRO_ARRAY:
        return "std::vector<" + generateType(n->leafAt(0)) + " >";
    case avro::AVRO_MAP:
        return "std::map<std::string, " + generateType(n->leafAt(1)) + " >";
    case avro::AVRO_RECORD:
        return generateRecordType(n);
    case avro::AVRO_ENUM:
        return generateEnumType(n);
    case avro::AVRO_UNION:
        return generateUnionType(n);
    default:
        break;
    }
    return "$Undefuned$";
}